

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O3

string * generateStringVector<std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__2>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    *__return_storage_ptr__,undefined8 *data)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *extraout_RAX;
  string *psVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint *puVar10;
  undefined8 uVar11;
  uint uVar12;
  string __str_1;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_t local_58;
  uint *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  puVar10 = (uint *)*data;
  local_38 = (uint *)data[1];
  if (puVar10 != local_38) {
    do {
      uVar1 = *puVar10;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar12 = 1;
      if (9 < uVar3) {
        uVar8 = (ulong)uVar3;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          uVar5 = (uint)uVar8;
          if (uVar5 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0036301f;
          }
          if (uVar5 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0036301f;
          }
          if (uVar5 < 10000) goto LAB_0036301f;
          uVar8 = uVar8 / 10000;
          uVar4 = uVar12 + 4;
        } while (99999 < uVar5);
        uVar12 = uVar12 + 1;
      }
LAB_0036301f:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_78,(ulong)(uVar12 + -((int)uVar1 >> 0x1f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_78._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),uVar12,uVar3);
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_78,"::");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar6->_M_dataplus)._M_p;
      paVar9 = &pbVar6->field_2;
      if (paVar2 == paVar9) {
        local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_d8._M_dataplus._M_p = (pointer)paVar2;
      }
      local_d8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      uVar1 = puVar10[1];
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar12 = 1;
      if (9 < uVar3) {
        uVar8 = (ulong)uVar3;
        uVar4 = 4;
        do {
          uVar12 = uVar4;
          uVar5 = (uint)uVar8;
          if (uVar5 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_00363114;
          }
          if (uVar5 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_00363114;
          }
          if (uVar5 < 10000) goto LAB_00363114;
          uVar8 = uVar8 / 10000;
          uVar4 = uVar12 + 4;
        } while (99999 < uVar5);
        uVar12 = uVar12 + 1;
      }
LAB_00363114:
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_98,(ulong)(uVar12 + -((int)uVar1 >> 0x1f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_98._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),uVar12,uVar3);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        uVar11 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_98._M_string_length + local_d8._M_string_length) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          uVar11 = local_98.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_98._M_string_length + local_d8._M_string_length)
        goto LAB_0036319b;
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_98,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      }
      else {
LAB_0036319b:
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_d8,local_98._M_dataplus._M_p,local_98._M_string_length);
      }
      local_b8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar2 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar2) {
        local_b8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar2;
      pbVar6->_M_string_length = 0;
      paVar2->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_d8,&local_b8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_58,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_d8,-1,' ',true,hex);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_d8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,',');
      puVar10 = puVar10 + 2;
    } while (puVar10 != local_38);
  }
  psVar7 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar7 < (string *)0x2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
    psVar7 = extraout_RAX;
  }
  else {
    ((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)psVar7] = ']';
  }
  return psVar7;
}

Assistant:

std::string generateStringVector(const X& data, Proc generator)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        ret.append(helics::generateJsonQuotedString(generator(ele)));
        ret.push_back(',');
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}